

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.h
# Opt level: O2

void __thiscall
ImageSpec::ImageSpec(ImageSpec *this,uint32_t w,uint32_t h,uint32_t d,FormatDescriptor *formatDesc)

{
  FormatDescriptor FStack_98;
  
  FormatDescriptor::FormatDescriptor(&FStack_98,formatDesc);
  FormatDescriptor::FormatDescriptor(&this->formatDesc,&FStack_98);
  this->imageWidth = w;
  this->imageHeight = h;
  this->imageDepth = d;
  (this->imageOrigin).x = '\0';
  (this->imageOrigin).y = '\0';
  (this->imageOrigin).z = '\0';
  FormatDescriptor::~FormatDescriptor(&FStack_98);
  return;
}

Assistant:

ImageSpec(uint32_t w, uint32_t h, uint32_t d, FormatDescriptor& formatDesc)
        : ImageSpec(w, h, d, Origin(), formatDesc) { }